

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaLoader::StoreAnimations(ColladaLoader *this,aiScene *pScene,ColladaParser *pParser)

{
  vector<aiAnimation_*,_std::allocator<aiAnimation_*>_> *this_00;
  aiAnimation *paVar1;
  pointer pcVar2;
  iterator iVar3;
  aiAnimation *paVar4;
  aiNodeAnim **ppaVar5;
  ulong uVar6;
  aiAnimation **__dest;
  pointer pcVar7;
  pointer __src;
  uint uVar8;
  size_t b;
  ulong uVar9;
  bool bVar10;
  pointer ppaVar11;
  size_t __n;
  allocator<char> local_4d9;
  vector<unsigned_long,_std::allocator<unsigned_long>_> collectedAnimIndices;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  animTargets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string channelName;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&channelName,"",(allocator<char> *)&animTargets);
  StoreAnimations(this,pScene,pParser,&pParser->mAnims,&channelName);
  std::__cxx11::string::~string((string *)&channelName);
  this_00 = &this->mAnims;
  pcVar7 = (pointer)0x0;
LAB_003eeb25:
  __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
          super__Vector_impl_data._M_start;
  ppaVar11 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  pcVar2 = (pointer)((long)ppaVar11 - (long)__src >> 3);
  if (pcVar2 <= pcVar7) {
    if (__src != ppaVar11) {
      pScene->mNumAnimations = (uint)pcVar2;
      uVar6 = (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      uVar9 = 0xffffffffffffffff;
      if (-1 < (long)uVar6) {
        uVar9 = uVar6;
      }
      __dest = (aiAnimation **)operator_new__(uVar9);
      pScene->mAnimations = __dest;
      __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
      ppaVar11 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      if ((long)ppaVar11 - (long)__src == 0) {
        return;
      }
      memmove(__dest,__src,(long)ppaVar11 - (long)__src);
    }
    if (ppaVar11 != __src) {
      (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>._M_impl.
      super__Vector_impl_data._M_finish = __src;
    }
    return;
  }
  paVar1 = __src[(long)pcVar7];
  if (paVar1->mNumChannels == 1) {
    collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    channelName._M_dataplus._M_p = pcVar7;
    do {
      do {
        channelName._M_dataplus._M_p = channelName._M_dataplus._M_p + 1;
        if ((pointer)((long)ppaVar11 - (long)__src >> 3) <= channelName._M_dataplus._M_p) {
          animTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
          animTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
          animTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
               &animTargets._M_t._M_impl.super__Rb_tree_header._M_header;
          animTargets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
          animTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
               animTargets._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&channelName,((*paVar1->mChannels)->mNodeName).data,
                     (allocator<char> *)&local_478);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&animTargets,&channelName);
          std::__cxx11::string::~string((string *)&channelName);
          bVar10 = true;
          uVar9 = 0;
          goto LAB_003eec36;
        }
        paVar4 = __src[(long)channelName._M_dataplus._M_p];
      } while ((((paVar4->mNumChannels != 1) || (paVar4->mDuration != paVar1->mDuration)) ||
               (NAN(paVar4->mDuration) || NAN(paVar1->mDuration))) ||
              ((paVar4->mTicksPerSecond != paVar1->mTicksPerSecond ||
               (NAN(paVar4->mTicksPerSecond) || NAN(paVar1->mTicksPerSecond)))));
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                (&collectedAnimIndices,(value_type_conflict7 *)&channelName);
      __src = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
      ppaVar11 = (this->mAnims).super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
    } while( true );
  }
  goto LAB_003eeed9;
  while( true ) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&channelName,
               ((*(this_00->super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>).
                  _M_impl.super__Vector_impl_data._M_start
                  [collectedAnimIndices.
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar9]]->mChannels)->mNodeName).data,
               (allocator<char> *)&local_478);
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&animTargets._M_t,&channelName);
    if ((_Rb_tree_header *)iVar3._M_node == &animTargets._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&animTargets,&channelName);
    }
    else {
      bVar10 = false;
    }
    std::__cxx11::string::~string((string *)&channelName);
    uVar9 = uVar9 + 1;
    if ((_Rb_tree_header *)iVar3._M_node != &animTargets._M_t._M_impl.super__Rb_tree_header) break;
LAB_003eec36:
    if ((ulong)((long)collectedAnimIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)collectedAnimIndices.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar9) break;
  }
  if (bVar10) {
    if (collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_start !=
        collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      paVar4 = (aiAnimation *)operator_new(0x448);
      aiAnimation::aiAnimation(paVar4);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_458,"combinedAnim_",&local_4d9);
      std::operator+(&local_478,&local_458,(char)pcVar7 + '0');
      __n = local_478._M_string_length & 0xffffffff;
      if ((local_478._M_string_length & 0xfffffc00) != 0) {
        __n = 0x3ff;
      }
      channelName._M_dataplus._M_p._0_4_ = (ai_uint32)__n;
      memcpy((void *)((long)&channelName._M_dataplus._M_p + 4),local_478._M_dataplus._M_p,__n);
      *(undefined1 *)((long)&channelName._M_dataplus._M_p + __n + 4) = 0;
      (paVar4->mName).length = (ai_uint32)__n;
      memcpy((paVar4->mName).data,(void *)((long)&channelName._M_dataplus._M_p + 4),__n);
      (paVar4->mName).data[__n] = '\0';
      std::__cxx11::string::~string((string *)&local_478);
      std::__cxx11::string::~string((string *)&local_458);
      paVar4->mDuration = paVar1->mDuration;
      paVar4->mTicksPerSecond = paVar1->mTicksPerSecond;
      uVar8 = (int)((ulong)((long)collectedAnimIndices.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)collectedAnimIndices.
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                 _M_impl.super__Vector_impl_data._M_start) >> 3) + 1;
      paVar4->mNumChannels = uVar8;
      ppaVar5 = (aiNodeAnim **)operator_new__((ulong)uVar8 << 3);
      paVar4->mChannels = ppaVar5;
      *ppaVar5 = *paVar1->mChannels;
      *paVar1->mChannels = (aiNodeAnim *)0x0;
      aiAnimation::~aiAnimation(paVar1);
      operator_delete(paVar1,0x448);
      (this_00->super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>)._M_impl.
      super__Vector_impl_data._M_start[(long)pcVar7] = paVar4;
      for (uVar9 = 0;
          uVar9 < (ulong)((long)collectedAnimIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)collectedAnimIndices.
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
        paVar1 = (this_00->super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>).
                 _M_impl.super__Vector_impl_data._M_start
                 [collectedAnimIndices.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar9]];
        paVar4->mChannels[uVar9 + 1] = *paVar1->mChannels;
        *paVar1->mChannels = (aiNodeAnim *)0x0;
        aiAnimation::~aiAnimation(paVar1);
        operator_delete(paVar1,0x448);
      }
      for (; collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start !=
             collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_finish;
          collectedAnimIndices.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Vector_impl_data._M_finish =
               collectedAnimIndices.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1) {
        std::vector<aiAnimation_*,_std::allocator<aiAnimation_*>_>::erase
                  (this_00,(const_iterator)
                           ((this_00->
                            super__Vector_base<aiAnimation_*,_std::allocator<aiAnimation_*>_>).
                            _M_impl.super__Vector_impl_data._M_start +
                           collectedAnimIndices.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish[-1]));
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&animTargets._M_t);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&collectedAnimIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
  else {
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&animTargets._M_t);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              (&collectedAnimIndices.
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  }
LAB_003eeed9:
  pcVar7 = pcVar7 + 1;
  goto LAB_003eeb25;
}

Assistant:

void ColladaLoader::StoreAnimations( aiScene* pScene, const ColladaParser& pParser) {
    // recursively collect all animations from the collada scene
    StoreAnimations(pScene, pParser, &pParser.mAnims, "");

    // catch special case: many animations with the same length, each affecting only a single node.
    // we need to unite all those single-node-anims to a proper combined animation
    for(size_t a = 0; a < mAnims.size(); ++a) {
        aiAnimation* templateAnim = mAnims[a];

        if (templateAnim->mNumChannels == 1) {
            // search for other single-channel-anims with the same duration
            std::vector<size_t> collectedAnimIndices;
            for( size_t b = a+1; b < mAnims.size(); ++b) {
                aiAnimation* other = mAnims[b];
                if (other->mNumChannels == 1 && other->mDuration == templateAnim->mDuration &&
                    other->mTicksPerSecond == templateAnim->mTicksPerSecond)
						collectedAnimIndices.push_back(b);
            }

			// We only want to combine the animations if they have different channels
			std::set<std::string> animTargets;
			animTargets.insert(templateAnim->mChannels[0]->mNodeName.C_Str());
			bool collectedAnimationsHaveDifferentChannels = true;
			for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
			{
				aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
				std::string channelName = std::string(srcAnimation->mChannels[0]->mNodeName.C_Str());
				if (animTargets.find(channelName) == animTargets.end()) {
					animTargets.insert(channelName);
				} else {
					collectedAnimationsHaveDifferentChannels = false;
					break;
				}
			}

			if (!collectedAnimationsHaveDifferentChannels)
				continue;

            // if there are other animations which fit the template anim, combine all channels into a single anim
            if (!collectedAnimIndices.empty())
            {
                aiAnimation* combinedAnim = new aiAnimation();
                combinedAnim->mName = aiString(std::string("combinedAnim_") + char('0' + a));
                combinedAnim->mDuration = templateAnim->mDuration;
                combinedAnim->mTicksPerSecond = templateAnim->mTicksPerSecond;
                combinedAnim->mNumChannels = static_cast<unsigned int>(collectedAnimIndices.size() + 1);
                combinedAnim->mChannels = new aiNodeAnim*[combinedAnim->mNumChannels];
                // add the template anim as first channel by moving its aiNodeAnim to the combined animation
                combinedAnim->mChannels[0] = templateAnim->mChannels[0];
                templateAnim->mChannels[0] = NULL;
                delete templateAnim;
                // combined animation replaces template animation in the anim array
                mAnims[a] = combinedAnim;

                // move the memory of all other anims to the combined anim and erase them from the source anims
                for (size_t b = 0; b < collectedAnimIndices.size(); ++b)
                {
                    aiAnimation* srcAnimation = mAnims[collectedAnimIndices[b]];
                    combinedAnim->mChannels[1 + b] = srcAnimation->mChannels[0];
                    srcAnimation->mChannels[0] = NULL;
                    delete srcAnimation;
                }

                // in a second go, delete all the single-channel-anims that we've stripped from their channels
                // back to front to preserve indices - you know, removing an element from a vector moves all elements behind the removed one
                while (!collectedAnimIndices.empty())
                {
                    mAnims.erase(mAnims.begin() + collectedAnimIndices.back());
                    collectedAnimIndices.pop_back();
                }
            }
        }
    }

    // now store all anims in the scene
    if (!mAnims.empty())
    {
        pScene->mNumAnimations = static_cast<unsigned int>(mAnims.size());
        pScene->mAnimations = new aiAnimation*[mAnims.size()];
        std::copy(mAnims.begin(), mAnims.end(), pScene->mAnimations);
    }

    mAnims.clear();
}